

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O3

void __thiscall notch::core::HingeLoss::HingeLoss(HingeLoss *this)

{
  float *pfVar1;
  
  (this->super_ALossLayer).shared.outputBuffer.
  super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_ALossLayer).shared.outputBuffer.
  super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ALossLayer).shared.inputBuffer.
  super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_ALossLayer).shared.inputBuffer.
  super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ALossLayer)._vptr_ALossLayer = (_func_int **)&PTR_tag_abi_cxx11__001a4b08;
  (this->lossGrad)._M_size = 1;
  pfVar1 = (float *)operator_new(4);
  (this->lossGrad)._M_data = pfVar1;
  *pfVar1 = 0.0;
  return;
}

Assistant:

HingeLoss() : lossGrad(1) {}